

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_vdpu382.c
# Opt level: O0

MPP_RET hal_avs2d_vdpu382_init(void *hal,MppHalCfg *cfg)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  Avs2dHalCtx_t *p_hal;
  Avs2dVdpu382RegCtx_t *reg_ctx;
  uint local_28;
  RK_U32 loop;
  RK_U32 i;
  MPP_RET ret;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  if ((avs2d_hal_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","In.","hal_avs2d_vdpu382_init");
  }
  if (hal == (void *)0x0) {
    loop = 0xfffffc16;
    if ((avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu382","input empty(%d).\n",(char *)0x0,0x24c);
    }
LAB_00255905:
    if ((avs2d_hal_debug & 0x100) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu382","Out. ret %d","hal_avs2d_vdpu382_init",(ulong)loop);
    }
    hal_local._4_4_ = loop;
  }
  else {
    pvVar4 = mpp_osal_calloc("hal_avs2d_vdpu382_init",0x6e0);
    *(void **)((long)hal + 0x5a8) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      loop = 0xfffffffc;
      _mpp_log_l(2,"hal_avs2d_vdpu382","malloc buffer error(%d).\n","hal_avs2d_vdpu382_init",0x24e);
    }
    else {
      lVar1 = *(long *)((long)hal + 0x5a8);
      uVar2 = 1;
      if (*(int *)((long)hal + 0x5a0) != 0) {
        uVar2 = 3;
      }
      loop = mpp_buffer_get_with_tag
                       (*(MppBufferGroup *)((long)hal + 0x20),(MppBuffer *)(lVar1 + 0x1d8),
                        (ulong)(uVar2 << 0xd),"hal_avs2d_vdpu382","hal_avs2d_vdpu382_init");
      if (MPP_NOK < (int)loop) {
        iVar3 = mpp_buffer_get_fd_with_caller
                          (*(MppBuffer *)(lVar1 + 0x1d8),"hal_avs2d_vdpu382_init");
        *(int *)(lVar1 + 0x1e0) = iVar3;
        pvVar4 = mpp_buffer_get_ptr_with_caller
                           (*(MppBuffer *)(lVar1 + 0x1d8),"hal_avs2d_vdpu382_init");
        *(void **)(lVar1 + 0x1e8) = pvVar4;
        for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
          pvVar4 = mpp_osal_calloc("hal_avs2d_vdpu382_init",0x2a4);
          *(void **)(lVar1 + (ulong)local_28 * 0x18 + 0x10) = pvVar4;
          init_common_regs(*(Vdpu382Avs2dRegSet **)(lVar1 + (ulong)local_28 * 0x18 + 0x10));
          *(uint *)(lVar1 + (ulong)local_28 * 0x18 + 4) = local_28 << 0xd;
          *(uint *)(lVar1 + (ulong)local_28 * 0x18 + 8) = local_28 * 0x2000 + 0x1000;
        }
        if (*(int *)((long)hal + 0x5a0) == 0) {
          *(undefined8 *)(lVar1 + 0x50) = *(undefined8 *)(lVar1 + 0x10);
          *(undefined4 *)(lVar1 + 0x48) = *(undefined4 *)(lVar1 + 4);
          *(undefined4 *)(lVar1 + 0x4c) = *(undefined4 *)(lVar1 + 8);
        }
        if (((cfg->cfg->base).out_fmt & 0xf00000) == MPP_FMT_YUV420SP) {
          mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_HOR_ALIGN,avs2d_hor_align);
        }
        else {
          mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_HOR_ALIGN,avs2d_hor_align_64);
        }
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_HOR_ALIGN,avs2d_hor_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_VER_ALIGN,avs2d_ver_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_LEN_ALIGN,avs2d_len_align);
        goto LAB_00255905;
      }
      if ((avs2d_hal_debug & 4) != 0) {
        _mpp_log_l(4,"hal_avs2d_vdpu382","Function error(%d).\n",(char *)0x0,0x253);
      }
    }
    hal_avs2d_vdpu382_deinit(hal);
    if ((avs2d_hal_debug & 0x100) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu382","Out. ret %d","hal_avs2d_vdpu382_init",(ulong)loop);
    }
    hal_local._4_4_ = loop;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_avs2d_vdpu382_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i, loop;
    Avs2dVdpu382RegCtx_t *reg_ctx;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;

    AVS2D_HAL_TRACE("In.");

    INP_CHECK(ret, NULL == p_hal);

    MEM_CHECK(ret, p_hal->reg_ctx = mpp_calloc_size(void, sizeof(Avs2dVdpu382RegCtx_t)));
    reg_ctx = (Avs2dVdpu382RegCtx_t *)p_hal->reg_ctx;

    //!< malloc buffers
    loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;
    FUN_CHECK(ret = mpp_buffer_get(p_hal->buf_group, &reg_ctx->bufs, AVS2_ALL_TBL_BUF_SIZE(loop)));
    reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
    reg_ctx->bufs_ptr = mpp_buffer_get_ptr(reg_ctx->bufs);

    for (i = 0; i < loop; i++) {
        reg_ctx->reg_buf[i].regs = mpp_calloc(Vdpu382Avs2dRegSet, 1);
        init_common_regs(reg_ctx->reg_buf[i].regs);
        reg_ctx->reg_buf[i].offset_shph = AVS2_SHPH_OFFSET(i);
        reg_ctx->reg_buf[i].offset_sclst = AVS2_SCALIST_OFFSET(i);
    }

    if (!p_hal->fast_mode) {
        reg_ctx->regs = reg_ctx->reg_buf[0].regs;
        reg_ctx->shph_offset = reg_ctx->reg_buf[0].offset_shph;
        reg_ctx->sclst_offset = reg_ctx->reg_buf[0].offset_sclst;
    }

    if (MPP_FRAME_FMT_IS_FBC(cfg->cfg->base.out_fmt))
        mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, avs2d_hor_align_64);
    else
        mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, avs2d_hor_align);

    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, avs2d_hor_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_VER_ALIGN, avs2d_ver_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_LEN_ALIGN, avs2d_len_align);

__RETURN:
    AVS2D_HAL_TRACE("Out. ret %d", ret);
    (void)cfg;
    return ret;
__FAILED:
    hal_avs2d_vdpu382_deinit(p_hal);
    AVS2D_HAL_TRACE("Out. ret %d", ret);
    return ret;
}